

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
duckdb::ColumnReader::CreateReader(ParquetReader *reader,ParquetColumnSchema *schema)

{
  int iVar1;
  LogicalTypeId LVar2;
  undefined8 uVar3;
  NotImplementedException *this;
  string *msg;
  long in_RDX;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_> in_RDI;
  LogicalType *in_stack_00000368;
  string *in_stack_fffffffffffffd58;
  ParquetColumnSchema *in_stack_fffffffffffffd60;
  ParquetReader *in_stack_fffffffffffffd68;
  allocator *paVar4;
  ParquetColumnSchema *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  ParquetColumnSchema *in_stack_fffffffffffffdc0;
  ParquetReader *in_stack_fffffffffffffdc8;
  allocator local_1c9;
  string local_1c8 [46];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [62];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [70];
  undefined1 local_112;
  allocator local_111;
  string local_110 [67];
  undefined1 local_cd;
  allocator local_b9;
  string local_b8 [160];
  long local_18;
  
  local_18 = in_RDX;
  LVar2 = LogicalType::id((LogicalType *)(in_RDX + 0x28));
  switch(LVar2) {
  case SQLNULL:
    make_uniq<duckdb::NullColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::NullColumnReader,std::default_delete<std::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>>>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::NullColumnReader,_std::default_delete<duckdb::NullColumnReader>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::NullColumnReader,_std::default_delete<duckdb::NullColumnReader>,_true>::
    ~unique_ptr((unique_ptr<duckdb::NullColumnReader,_std::default_delete<duckdb::NullColumnReader>,_true>
                 *)0x229315d);
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    LogicalType::ToString_abi_cxx11_(in_stack_00000368);
    NotImplementedException::NotImplementedException
              ((NotImplementedException *)in_stack_fffffffffffffd60,msg);
    __cxa_throw(msg,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case BOOLEAN:
    make_uniq<duckdb::BooleanColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::BooleanColumnReader,std::default_delete<std::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>>>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::BooleanColumnReader,_std::default_delete<duckdb::BooleanColumnReader>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::BooleanColumnReader,_std::default_delete<duckdb::BooleanColumnReader>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BooleanColumnReader,_std::default_delete<duckdb::BooleanColumnReader>,_true>
                   *)0x229237f);
    break;
  case TINYINT:
    make_uniq<duckdb::TemplatedColumnReader<signed_char,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<signed_char,duckdb::TemplatedParquetValueConversion<int>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<signed_char,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<signed_char,_duckdb::TemplatedParquetValueConversion<int>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<signed_char,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<signed_char,_duckdb::TemplatedParquetValueConversion<int>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<signed_char,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<signed_char,_duckdb::TemplatedParquetValueConversion<int>_>_>,_true>
                   *)0x22924d3);
    break;
  case SMALLINT:
    make_uniq<duckdb::TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<int>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<short,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<short,_duckdb::TemplatedParquetValueConversion<int>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<short,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<short,_duckdb::TemplatedParquetValueConversion<int>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<short,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<short,_duckdb::TemplatedParquetValueConversion<int>_>_>,_true>
                   *)0x2292517);
    break;
  case INTEGER:
    make_uniq<duckdb::TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<int>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<int,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<int,_duckdb::TemplatedParquetValueConversion<int>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<int,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<int,_duckdb::TemplatedParquetValueConversion<int>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<int,_duckdb::TemplatedParquetValueConversion<int>_>,_std::default_delete<duckdb::TemplatedColumnReader<int,_duckdb::TemplatedParquetValueConversion<int>_>_>,_true>
                   *)0x229255b);
    break;
  case BIGINT:
    make_uniq<duckdb::TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<long>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<long,_duckdb::TemplatedParquetValueConversion<long>_>,_std::default_delete<duckdb::TemplatedColumnReader<long,_duckdb::TemplatedParquetValueConversion<long>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<long,_duckdb::TemplatedParquetValueConversion<long>_>,_std::default_delete<duckdb::TemplatedColumnReader<long,_duckdb::TemplatedParquetValueConversion<long>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<long,_duckdb::TemplatedParquetValueConversion<long>_>,_std::default_delete<duckdb::TemplatedColumnReader<long,_duckdb::TemplatedParquetValueConversion<long>_>_>,_true>
                   *)0x229259f);
    break;
  case DATE:
    make_uniq<duckdb::CallbackColumnReader<int,duckdb::date_t,&duckdb::ParquetIntToDate>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::CallbackColumnReader<int,duckdb::date_t,&duckdb::ParquetIntToDate>,std::default_delete<int_const>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::date_t,_&duckdb::ParquetIntToDate>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::date_t,_&duckdb::ParquetIntToDate>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::date_t,_&duckdb::ParquetIntToDate>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::date_t,_&duckdb::ParquetIntToDate>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::date_t,_&duckdb::ParquetIntToDate>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::date_t,_&duckdb::ParquetIntToDate>_>,_true>
                   *)0x2292b29);
    break;
  case TIME:
    iVar1 = *(int *)(local_18 + 0x74);
    if (iVar1 == 2) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTimeNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTimeNs>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeNs>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeNs>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeNs>_>,_true>
                     *)0x2292c28);
    }
    else if (iVar1 == 3) {
      make_uniq<duckdb::CallbackColumnReader<int,duckdb::dtime_t,&duckdb::ParquetIntToTimeMs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<int,duckdb::dtime_t,&duckdb::ParquetIntToTimeMs>,std::default_delete<int_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeMs>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeMs>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeMs>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeMs>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeMs>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::dtime_t,_&duckdb::ParquetIntToTimeMs>_>,_true>
                     *)0x2292ba0);
    }
    else {
      if (iVar1 != 4) {
        local_15a = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_158,"TIME requires type info",&local_159);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        local_15a = 0;
        __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
      }
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTime>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTime>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTime>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTime>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTime>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTime>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTime>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_t,_&duckdb::ParquetIntToTime>_>,_true>
                     *)0x2292be4);
    }
    break;
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    switch(*(undefined4 *)(local_18 + 0x74)) {
    case 1:
      make_uniq<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_t,&duckdb::ImpalaTimestampToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_t,&duckdb::ImpalaTimestampToTimestamp>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::unique_ptr_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_t,_&duckdb::ImpalaTimestampToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_t,_&duckdb::ImpalaTimestampToTimestamp>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_t,_&duckdb::ImpalaTimestampToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_t,_&duckdb::ImpalaTimestampToTimestamp>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_t,_&duckdb::ImpalaTimestampToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_t,_&duckdb::ImpalaTimestampToTimestamp>_>,_true>
                     *)0x229271f);
      break;
    case 2:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampNsToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampNsToTimestamp>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampNsToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampNsToTimestamp>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampNsToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampNsToTimestamp>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampNsToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampNsToTimestamp>_>,_true>
                     *)0x22927eb);
      break;
    case 3:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMsToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMsToTimestamp>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMsToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMsToTimestamp>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMsToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMsToTimestamp>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMsToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMsToTimestamp>_>,_true>
                     *)0x2292763);
      break;
    case 4:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMicrosToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMicrosToTimestamp>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMicrosToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMicrosToTimestamp>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMicrosToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMicrosToTimestamp>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMicrosToTimestamp>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_t,_&duckdb::ParquetTimestampMicrosToTimestamp>_>,_true>
                     *)0x22927a7);
      break;
    default:
      local_cd = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      paVar4 = &local_b9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"TIMESTAMP requires type info",paVar4);
      InternalException::InternalException
                ((InternalException *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_cd = 0;
      __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
    }
    break;
  case TIMESTAMP_NS:
    switch(*(undefined4 *)(local_18 + 0x74)) {
    case 1:
      make_uniq<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_ns_t,&duckdb::ImpalaTimestampToTimestampNS>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_ns_t,&duckdb::ImpalaTimestampToTimestampNS>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::unique_ptr_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_ns_t,_&duckdb::ImpalaTimestampToTimestampNS>,_std::default_delete<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_ns_t,_&duckdb::ImpalaTimestampToTimestampNS>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_ns_t,_&duckdb::ImpalaTimestampToTimestampNS>,_std::default_delete<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_ns_t,_&duckdb::ImpalaTimestampToTimestampNS>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_ns_t,_&duckdb::ImpalaTimestampToTimestampNS>,_std::default_delete<duckdb::CallbackColumnReader<duckdb::Int96,_duckdb::timestamp_ns_t,_&duckdb::ImpalaTimestampToTimestampNS>_>,_true>
                     *)0x229293d);
      break;
    case 2:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampNsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampNsToTimestampNs>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampNsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampNsToTimestampNs>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampNsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampNsToTimestampNs>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampNsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampNsToTimestampNs>_>,_true>
                     *)0x2292a09);
      break;
    case 3:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampMsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampMsToTimestampNs>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampMsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampMsToTimestampNs>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampMsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampMsToTimestampNs>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampMsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampMsToTimestampNs>_>,_true>
                     *)0x2292981);
      break;
    case 4:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampUsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampUsToTimestampNs>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampUsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampUsToTimestampNs>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampUsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampUsToTimestampNs>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampUsToTimestampNs>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::timestamp_ns_t,_&duckdb::ParquetTimestampUsToTimestampNs>_>,_true>
                     *)0x22929c5);
      break;
    default:
      local_112 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_110,"TIMESTAMP_NS requires type info",&local_111);
      InternalException::InternalException
                ((InternalException *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_112 = 0;
      __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
    }
    break;
  case DECIMAL:
    iVar1 = *(int *)(local_18 + 0x74);
    if (iVar1 == 5) {
      ParquetDecimalUtils::CreateReader(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    }
    else if (iVar1 == 6) {
      CreateDecimalReader<int>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    }
    else {
      if (iVar1 != 7) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        paVar4 = &local_1c9;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1c8,"Unrecognized Parquet type for Decimal",paVar4);
        NotImplementedException::NotImplementedException(this,in_stack_fffffffffffffd58);
        __cxa_throw(this,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      CreateDecimalReader<long>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    }
    break;
  case FLOAT:
    if (*(int *)(local_18 + 0x74) == 8) {
      make_uniq<duckdb::CallbackColumnReader<unsigned_short,float,&duckdb::Float16ToFloat32>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<unsigned_short,float,&duckdb::Float16ToFloat32>,std::default_delete<unsigned_short_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<unsigned_short,_float,_&duckdb::Float16ToFloat32>,_std::default_delete<duckdb::CallbackColumnReader<unsigned_short,_float,_&duckdb::Float16ToFloat32>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<unsigned_short,_float,_&duckdb::Float16ToFloat32>,_std::default_delete<duckdb::CallbackColumnReader<unsigned_short,_float,_&duckdb::Float16ToFloat32>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<unsigned_short,_float,_&duckdb::Float16ToFloat32>,_std::default_delete<duckdb::CallbackColumnReader<unsigned_short,_float,_&duckdb::Float16ToFloat32>_>,_true>
                     *)0x22925f1);
    }
    else {
      make_uniq<duckdb::TemplatedColumnReader<float,duckdb::TemplatedParquetValueConversion<float>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::TemplatedColumnReader<float,duckdb::TemplatedParquetValueConversion<float>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::TemplatedColumnReader<float,_duckdb::TemplatedParquetValueConversion<float>_>,_std::default_delete<duckdb::TemplatedColumnReader<float,_duckdb::TemplatedParquetValueConversion<float>_>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::TemplatedColumnReader<float,_duckdb::TemplatedParquetValueConversion<float>_>,_std::default_delete<duckdb::TemplatedColumnReader<float,_duckdb::TemplatedParquetValueConversion<float>_>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<float,_duckdb::TemplatedParquetValueConversion<float>_>,_std::default_delete<duckdb::TemplatedColumnReader<float,_duckdb::TemplatedParquetValueConversion<float>_>_>,_true>
                     *)0x2292635);
    }
    break;
  case DOUBLE:
    if (*(int *)(local_18 + 0x74) == 5) {
      ParquetDecimalUtils::CreateReader(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    }
    else {
      make_uniq<duckdb::TemplatedColumnReader<double,duckdb::TemplatedParquetValueConversion<double>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::TemplatedColumnReader<double,duckdb::TemplatedParquetValueConversion<double>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::TemplatedColumnReader<double,_duckdb::TemplatedParquetValueConversion<double>_>,_std::default_delete<duckdb::TemplatedColumnReader<double,_duckdb::TemplatedParquetValueConversion<double>_>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::TemplatedColumnReader<double,_duckdb::TemplatedParquetValueConversion<double>_>,_std::default_delete<duckdb::TemplatedColumnReader<double,_duckdb::TemplatedParquetValueConversion<double>_>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<double,_duckdb::TemplatedParquetValueConversion<double>_>,_std::default_delete<duckdb::TemplatedColumnReader<double,_duckdb::TemplatedParquetValueConversion<double>_>_>,_true>
                     *)0x22926a9);
    }
    break;
  case VARCHAR:
  case BLOB:
    make_uniq<duckdb::StringColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::StringColumnReader,std::default_delete<std::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>>>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::StringColumnReader,_std::default_delete<duckdb::StringColumnReader>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::StringColumnReader,_std::default_delete<duckdb::StringColumnReader>,_true>::
    ~unique_ptr((unique_ptr<duckdb::StringColumnReader,_std::default_delete<duckdb::StringColumnReader>,_true>
                 *)0x2292f23);
    break;
  case INTERVAL:
    make_uniq<duckdb::IntervalColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::IntervalColumnReader,std::default_delete<std::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>>>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::IntervalColumnReader,_std::default_delete<duckdb::IntervalColumnReader>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::IntervalColumnReader,_std::default_delete<duckdb::IntervalColumnReader>,_true>
    ::~unique_ptr((unique_ptr<duckdb::IntervalColumnReader,_std::default_delete<duckdb::IntervalColumnReader>,_true>
                   *)0x2293119);
    break;
  case UTINYINT:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<unsigned_char,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_char,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_char,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_char,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<unsigned_char,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_char,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>,_true>
                   *)0x22923c3);
    break;
  case USMALLINT:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_short,duckdb::TemplatedParquetValueConversion<unsigned_int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_short,duckdb::TemplatedParquetValueConversion<unsigned_int>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<unsigned_short,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_short,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_short,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_short,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<unsigned_short,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_short,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>,_true>
                   *)0x2292407);
    break;
  case UINTEGER:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_int,duckdb::TemplatedParquetValueConversion<unsigned_int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_int,duckdb::TemplatedParquetValueConversion<unsigned_int>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<unsigned_int,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_int,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_int,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_int,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<unsigned_int,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_int,_duckdb::TemplatedParquetValueConversion<unsigned_int>_>_>,_true>
                   *)0x229244b);
    break;
  case UBIGINT:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_long,duckdb::TemplatedParquetValueConversion<unsigned_long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_long,duckdb::TemplatedParquetValueConversion<unsigned_long>>,std::default_delete<duckdb::TemplatedParquetValueConversion>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::TemplatedColumnReader<unsigned_long,_duckdb::TemplatedParquetValueConversion<unsigned_long>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_long,_duckdb::TemplatedParquetValueConversion<unsigned_long>_>_>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::TemplatedColumnReader<unsigned_long,_duckdb::TemplatedParquetValueConversion<unsigned_long>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_long,_duckdb::TemplatedParquetValueConversion<unsigned_long>_>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::TemplatedColumnReader<unsigned_long,_duckdb::TemplatedParquetValueConversion<unsigned_long>_>,_std::default_delete<duckdb::TemplatedColumnReader<unsigned_long,_duckdb::TemplatedParquetValueConversion<unsigned_long>_>_>,_true>
                   *)0x229248f);
    break;
  case TIME_TZ:
    iVar1 = *(int *)(local_18 + 0x74);
    if (iVar1 == 2) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeNsTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(2,in_stack_fffffffffffffd88),in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeNsTZ>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeNsTZ>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeNsTZ>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeNsTZ>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeNsTZ>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeNsTZ>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeNsTZ>_>,_true>
                     *)0x2292e03);
    }
    else if (iVar1 == 3) {
      make_uniq<duckdb::CallbackColumnReader<int,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeMsTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(3,in_stack_fffffffffffffd88),in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<int,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeMsTZ>,std::default_delete<int_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeMsTZ>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeMsTZ>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeMsTZ>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeMsTZ>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<int,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeMsTZ>,_std::default_delete<duckdb::CallbackColumnReader<int,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeMsTZ>_>,_true>
                     *)0x2292d7b);
    }
    else {
      if (iVar1 != 4) {
        local_19a = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        paVar4 = &local_199;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_198,"TIME_TZ requires type info",paVar4);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        local_19a = 0;
        __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
      }
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((ParquetReader *)CONCAT44(4,in_stack_fffffffffffffd88),in_stack_fffffffffffffd80);
      unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
      unique_ptr<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeTZ>,std::default_delete<long_const>,void>
                ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeTZ>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeTZ>_>_>
                  *)in_stack_fffffffffffffd58);
      unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeTZ>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeTZ>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeTZ>,_std::default_delete<duckdb::CallbackColumnReader<long,_duckdb::dtime_tz_t,_&duckdb::ParquetIntToTimeTZ>_>,_true>
                     *)0x2292dbf);
    }
    break;
  case UUID:
    make_uniq<duckdb::UUIDColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((ParquetReader *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>::
    unique_ptr<duckdb::UUIDColumnReader,std::default_delete<std::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>>>,void>
              ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::UUIDColumnReader,_std::default_delete<duckdb::UUIDColumnReader>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::UUIDColumnReader,_std::default_delete<duckdb::UUIDColumnReader>,_true>::
    ~unique_ptr((unique_ptr<duckdb::UUIDColumnReader,_std::default_delete<duckdb::UUIDColumnReader>,_true>
                 *)0x22930d5);
  }
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (__uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
         super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnReader> ColumnReader::CreateReader(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnReader>(reader, schema);
	case LogicalTypeId::UTINYINT:
		return make_uniq<TemplatedColumnReader<uint8_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::USMALLINT:
		return make_uniq<TemplatedColumnReader<uint16_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::UINTEGER:
		return make_uniq<TemplatedColumnReader<uint32_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::UBIGINT:
		return make_uniq<TemplatedColumnReader<uint64_t, TemplatedParquetValueConversion<uint64_t>>>(reader, schema);
	case LogicalTypeId::TINYINT:
		return make_uniq<TemplatedColumnReader<int8_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::SMALLINT:
		return make_uniq<TemplatedColumnReader<int16_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::INTEGER:
		return make_uniq<TemplatedColumnReader<int32_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::BIGINT:
		return make_uniq<TemplatedColumnReader<int64_t, TemplatedParquetValueConversion<int64_t>>>(reader, schema);
	case LogicalTypeId::FLOAT:
		if (schema.type_info == ParquetExtraTypeInfo::FLOAT16) {
			return make_uniq<CallbackColumnReader<uint16_t, float, Float16ToFloat32>>(reader, schema);
		}
		return make_uniq<TemplatedColumnReader<float, TemplatedParquetValueConversion<float>>>(reader, schema);
	case LogicalTypeId::DOUBLE:
		if (schema.type_info == ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY) {
			return ParquetDecimalUtils::CreateReader(reader, schema);
		}
		return make_uniq<TemplatedColumnReader<double, TemplatedParquetValueConversion<double>>>(reader, schema);
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::IMPALA_TIMESTAMP:
			return make_uniq<CallbackColumnReader<Int96, timestamp_t, ImpalaTimestampToTimestamp>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampMsToTimestamp>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampMicrosToTimestamp>>(reader,
			                                                                                                schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampNsToTimestamp>>(reader, schema);
		default:
			throw InternalException("TIMESTAMP requires type info");
		}
	case LogicalTypeId::TIMESTAMP_NS:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::IMPALA_TIMESTAMP:
			return make_uniq<CallbackColumnReader<Int96, timestamp_ns_t, ImpalaTimestampToTimestampNS>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampMsToTimestampNs>>(reader,
			                                                                                                 schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampUsToTimestampNs>>(reader,
			                                                                                                 schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampNsToTimestampNs>>(reader,
			                                                                                                 schema);
		default:
			throw InternalException("TIMESTAMP_NS requires type info");
		}
	case LogicalTypeId::DATE:
		return make_uniq<CallbackColumnReader<int32_t, date_t, ParquetIntToDate>>(reader, schema);
	case LogicalTypeId::TIME:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int32_t, dtime_t, ParquetIntToTimeMs>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_t, ParquetIntToTime>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_t, ParquetIntToTimeNs>>(reader, schema);
		default:
			throw InternalException("TIME requires type info");
		}
	case LogicalTypeId::TIME_TZ:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int32_t, dtime_tz_t, ParquetIntToTimeMsTZ>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_tz_t, ParquetIntToTimeTZ>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_tz_t, ParquetIntToTimeNsTZ>>(reader, schema);
		default:
			throw InternalException("TIME_TZ requires type info");
		}
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringColumnReader>(reader, schema);
	case LogicalTypeId::DECIMAL:
		// we have to figure out what kind of int we need
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::DECIMAL_INT32:
			return CreateDecimalReader<int32_t>(reader, schema);
		case ParquetExtraTypeInfo::DECIMAL_INT64:
			return CreateDecimalReader<int64_t>(reader, schema);
		case ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY:
			return ParquetDecimalUtils::CreateReader(reader, schema);
		default:
			throw NotImplementedException("Unrecognized Parquet type for Decimal");
		}
		break;
	case LogicalTypeId::UUID:
		return make_uniq<UUIDColumnReader>(reader, schema);
	case LogicalTypeId::INTERVAL:
		return make_uniq<IntervalColumnReader>(reader, schema);
	case LogicalTypeId::SQLNULL:
		return make_uniq<NullColumnReader>(reader, schema);
	default:
		break;
	}
	throw NotImplementedException(schema.type.ToString());
}